

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_image.h
# Opt level: O0

string * TextureImage::Texture::testAllSuffix(string *__return_storage_ptr__,string *no_suffix_name)

{
  char *__filename;
  FILE *__stream;
  string *local_158;
  FILE *ftest;
  allocator<char> local_c7;
  allocator<char> local_c6;
  allocator<char> local_c5;
  int i;
  allocator<char> local_b1;
  string *local_b0;
  string local_a8 [8];
  string support_suffix [4];
  int support_suffix_num;
  string *no_suffix_name_local;
  string *try_filename;
  
  local_b0 = local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a8,".bmp",&local_b1);
  local_b0 = (string *)(support_suffix[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(support_suffix[0].field_2._M_local_buf + 8),".jpg",&local_c5);
  local_b0 = (string *)(support_suffix[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(support_suffix[1].field_2._M_local_buf + 8),".png",&local_c6);
  local_b0 = (string *)(support_suffix[2].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(support_suffix[2].field_2._M_local_buf + 8),".tga",&local_c7);
  std::allocator<char>::~allocator(&local_c7);
  std::allocator<char>::~allocator(&local_c6);
  std::allocator<char>::~allocator(&local_c5);
  std::allocator<char>::~allocator(&local_b1);
  ftest._4_4_ = 0;
  do {
    if (3 < ftest._4_4_) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
LAB_0013c9bd:
      local_158 = (string *)(support_suffix[3].field_2._M_local_buf + 8);
      do {
        local_158 = local_158 + -0x20;
        std::__cxx11::string::~string(local_158);
      } while (local_158 != local_a8);
      return __return_storage_ptr__;
    }
    std::operator+(__return_storage_ptr__,no_suffix_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&support_suffix[(long)ftest._4_4_ + -1].field_2 + 8));
    __filename = (char *)std::__cxx11::string::c_str();
    __stream = fopen(__filename,"r");
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      goto LAB_0013c9bd;
    }
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    ftest._4_4_ = ftest._4_4_ + 1;
  } while( true );
}

Assistant:

static std::string testAllSuffix(std::string no_suffix_name) {
            const int support_suffix_num = 4;
            const std::string support_suffix[support_suffix_num] = {
                    ".bmp",
                    ".jpg",
                    ".png",
                    ".tga"
            };

            for (int i = 0; i < support_suffix_num; i++) {
                std::string try_filename = no_suffix_name + support_suffix[i];
                FILE *ftest = fopen(try_filename.c_str(), "r");
                if (ftest) {
                    fclose(ftest);
                    return try_filename;
                }
            }
            return std::string();
        }